

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O1

Result __thiscall wabt::TypeChecker::OnCatch(TypeChecker *this)

{
  LabelType LVar1;
  Result RVar2;
  Result RVar3;
  Enum EVar4;
  Label *label;
  Label *local_30;
  
  RVar2 = GetLabel(this,0,&local_30);
  EVar4 = Error;
  if (RVar2.enum_ != Error) {
    LVar1 = local_30->label_type;
    RVar2 = PopAndCheckSignature(this,&local_30->result_types,"try block");
    RVar3 = CheckTypeStackEnd(this,"try block");
    EVar4 = (Enum)((RVar3.enum_ == Error || RVar2.enum_ == Error) || LVar1 != Try);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::resize
              (&this->type_stack_,local_30->type_stack_limit);
    local_30->label_type = Catch;
    local_30->unreachable = false;
    PushType(this,(Type)0xffffffe8);
  }
  return (Result)EVar4;
}

Assistant:

Result TypeChecker::OnCatch() {
  Result result = Result::Ok;
  Label* label;
  CHECK_RESULT(TopLabel(&label));
  result |= CheckLabelType(label, LabelType::Try);
  result |= PopAndCheckSignature(label->result_types, "try block");
  result |= CheckTypeStackEnd("try block");
  ResetTypeStackToLabel(label);
  label->label_type = LabelType::Catch;
  label->unreachable = false;
  PushType(Type::Exnref);
  return result;
}